

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

size_t ZSTD_DUBT_findBestMatch
                 (ZSTD_matchState_t *ms,BYTE *ip,BYTE *iend,size_t *offsetPtr,U32 mls,
                 ZSTD_dictMode_e dictMode)

{
  BYTE *pBVar1;
  uint uVar2;
  U32 *pUVar3;
  ZSTD_matchState_t *pZVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  size_t sVar8;
  ulong uVar9;
  ulong *puVar10;
  ulong uVar11;
  ulong *puVar12;
  ulong uVar13;
  char cVar14;
  uint uVar15;
  int iVar16;
  ulong *puVar17;
  BYTE *pBVar18;
  uint *puVar19;
  ulong *puVar20;
  long lVar21;
  uint *puVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  ulong uVar27;
  uint *puVar28;
  uint uVar29;
  ulong uVar30;
  uint uVar31;
  ulong uVar32;
  BYTE *pBVar33;
  int iVar34;
  ulong uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  BYTE *pBVar41;
  BYTE *pBVar42;
  BYTE *pInLoopLimit_1;
  U32 *pUVar43;
  bool bVar44;
  BYTE *pInLoopLimit;
  U32 dummy32;
  int local_134;
  uint *local_128;
  BYTE *local_108;
  ulong local_f0;
  ulong local_e8;
  int local_b0;
  uint local_70;
  uint local_6c;
  BYTE *local_68;
  U32 *local_60;
  ulong local_58;
  ulong local_50;
  BYTE *local_48;
  BYTE *local_40;
  ulong *local_38;
  
  pUVar43 = ms->hashTable;
  local_58 = (ulong)(mls - 5);
  cVar14 = (char)(ms->cParams).hashLog;
  switch(local_58) {
  case 0:
    lVar21 = -0x30e4432345000000;
    break;
  case 1:
    lVar21 = -0x30e4432340650000;
    break;
  case 2:
    lVar21 = -0x30e44323405a9d00;
    break;
  case 3:
    uVar32 = *(long *)ip * -0x30e44323485a9b9d;
    goto LAB_006e1bab;
  default:
    uVar32 = (ulong)((uint)(*(int *)ip * -0x61c8864f) >> (-cVar14 & 0x1fU));
    goto LAB_006e1bb0;
  }
  uVar32 = lVar21 * *(long *)ip;
LAB_006e1bab:
  uVar32 = uVar32 >> (-cVar14 & 0x3fU);
LAB_006e1bb0:
  pBVar41 = (ms->window).base;
  uVar36 = (int)ip - (int)pBVar41;
  uVar2 = (ms->window).lowLimit;
  uVar23 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar29 = uVar36 - uVar23;
  if (uVar36 - uVar2 <= uVar23) {
    uVar29 = uVar2;
  }
  if (ms->loadedDictEnd != 0) {
    uVar29 = uVar2;
  }
  uVar24 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
  uVar23 = 0;
  uVar2 = uVar36 - uVar24;
  if (uVar36 < uVar24) {
    uVar2 = uVar23;
  }
  uVar25 = uVar29;
  if (uVar29 < uVar2) {
    uVar25 = uVar2;
  }
  uVar40 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
  pUVar3 = ms->chainTable;
  uVar26 = pUVar43[uVar32];
  uVar37 = uVar40;
  local_68 = pBVar41;
  if (uVar25 < pUVar43[uVar32]) {
    do {
      uVar15 = uVar26;
      uVar35 = (ulong)((uVar15 & uVar24) * 2);
      if ((pUVar3[uVar35 + 1] != 1) || (uVar37 < 2)) {
        if (pUVar3[uVar35 + 1] == 1) {
          (pUVar3 + uVar35)[0] = 0;
          (pUVar3 + uVar35)[1] = 0;
        }
        uVar15 = uVar23;
        if (uVar23 == 0) goto LAB_006e2060;
        break;
      }
      pUVar3[uVar35 + 1] = uVar23;
      uVar37 = uVar37 - 1;
      uVar23 = uVar15;
      uVar26 = pUVar3[uVar35];
    } while (uVar25 < pUVar3[uVar35]);
    local_108 = (ms->window).dictBase;
    local_60 = pUVar43;
    local_50 = uVar32;
    do {
      uVar23 = (ms->window).dictLimit;
      uVar32 = (ulong)uVar23;
      local_38 = (ulong *)(local_108 + uVar32);
      puVar17 = (ulong *)iend;
      pBVar42 = pBVar41;
      if (uVar15 < uVar23) {
        puVar17 = local_38;
        pBVar42 = local_108;
      }
      uVar38 = ~(-1 << ((char)(ms->cParams).chainLog - 1U & 0x1f));
      uVar35 = (ulong)((uVar15 & uVar38) * 2);
      uVar26 = (ms->window).lowLimit;
      uVar39 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
      uVar6 = uVar15 - uVar39;
      if (uVar15 - uVar26 <= uVar39) {
        uVar6 = uVar26;
      }
      uVar26 = pUVar3[(ulong)((uVar15 & uVar24) * 2) + 1];
      local_128 = pUVar3 + uVar35;
      puVar22 = pUVar3 + uVar35 + 1;
      if ((uVar37 != 0) && (uVar39 = pUVar3[uVar35], uVar6 < uVar39)) {
        local_40 = pBVar41 + uVar32;
        local_48 = pBVar42 + (ulong)uVar15 + 8;
        uVar35 = 0;
        uVar13 = 0;
        uVar31 = uVar37;
        do {
          uVar9 = uVar13;
          if (uVar35 < uVar13) {
            uVar9 = uVar35;
          }
          uVar30 = (ulong)uVar39;
          pBVar18 = pBVar41;
          if (dictMode == ZSTD_extDict) {
            if ((uVar15 < uVar23) || (uVar32 <= uVar9 + uVar30)) {
              if (uVar9 + uVar30 < uVar32) {
                pBVar18 = local_108;
              }
              goto LAB_006e1e9e;
            }
            sVar8 = ZSTD_count_2segments
                              (pBVar42 + uVar9 + uVar15,local_108 + uVar30 + uVar9,(BYTE *)puVar17,
                               (BYTE *)local_38,local_40);
            uVar9 = sVar8 + uVar9;
            pBVar18 = local_68 + uVar30;
            pBVar41 = local_68;
            if (uVar9 + uVar30 < uVar32) {
              pBVar18 = local_108 + uVar30;
            }
          }
          else {
LAB_006e1e9e:
            puVar12 = (ulong *)(pBVar42 + uVar9 + uVar15);
            puVar20 = (ulong *)(pBVar18 + uVar30 + uVar9);
            puVar10 = puVar12;
            if (puVar12 < (ulong *)((long)puVar17 - 7U)) {
              if (*puVar20 == *puVar12) {
                lVar21 = 0;
                do {
                  puVar10 = (ulong *)(local_48 + lVar21 + uVar9);
                  if ((ulong *)((long)puVar17 - 7U) <= puVar10) {
                    puVar20 = (ulong *)(pBVar18 + lVar21 + uVar30 + uVar9 + 8);
                    goto LAB_006e1f43;
                  }
                  lVar7 = lVar21 + uVar30 + uVar9 + 8;
                  lVar21 = lVar21 + 8;
                } while (*(ulong *)(pBVar18 + lVar7) == *puVar10);
                uVar11 = *puVar10 ^ *(ulong *)(pBVar18 + lVar7);
                uVar27 = 0;
                if (uVar11 != 0) {
                  for (; (uVar11 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                  }
                }
                uVar27 = (uVar27 >> 3 & 0x1fffffff) + lVar21;
              }
              else {
                uVar11 = *puVar12 ^ *puVar20;
                uVar27 = 0;
                if (uVar11 != 0) {
                  for (; (uVar11 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                  }
                }
                uVar27 = uVar27 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_006e1f43:
              if ((puVar10 < (ulong *)((long)puVar17 - 3U)) && ((int)*puVar20 == (int)*puVar10)) {
                puVar10 = (ulong *)((long)puVar10 + 4);
                puVar20 = (ulong *)((long)puVar20 + 4);
              }
              if ((puVar10 < (ulong *)((long)puVar17 + -1)) && ((short)*puVar20 == (short)*puVar10))
              {
                puVar10 = (ulong *)((long)puVar10 + 2);
                puVar20 = (ulong *)((long)puVar20 + 2);
              }
              if (puVar10 < puVar17) {
                puVar10 = (ulong *)((long)puVar10 + (ulong)((byte)*puVar20 == (byte)*puVar10));
              }
              uVar27 = (long)puVar10 - (long)puVar12;
            }
            uVar9 = uVar27 + uVar9;
            pBVar18 = pBVar18 + uVar30;
          }
          if ((ulong *)(pBVar42 + uVar9 + uVar15) == puVar17) break;
          puVar19 = pUVar3 + (uVar39 & uVar38) * 2;
          if (pBVar18[uVar9] < (byte)*(ulong *)(pBVar42 + uVar9 + uVar15)) {
            *local_128 = uVar39;
            if (uVar39 <= uVar25) {
              local_128 = &local_6c;
              break;
            }
            puVar19 = puVar19 + 1;
            uVar35 = uVar9;
            uVar9 = uVar13;
            local_128 = puVar19;
          }
          else {
            *puVar22 = uVar39;
            puVar22 = puVar19;
            if (uVar39 <= uVar25) {
              puVar22 = &local_6c;
              break;
            }
          }
          uVar31 = uVar31 - 1;
          if ((uVar31 == 0) || (uVar39 = *puVar19, uVar13 = uVar9, uVar39 <= uVar6)) break;
        } while( true );
      }
      *puVar22 = 0;
      *local_128 = 0;
      uVar37 = uVar37 + 1;
      uVar32 = local_50;
      pUVar43 = local_60;
      uVar15 = uVar26;
    } while (uVar26 != 0);
  }
  else {
LAB_006e2060:
    local_108 = (ms->window).dictBase;
  }
  uVar13 = (ulong)(ms->window).dictLimit;
  uVar35 = (ulong)((uVar24 & uVar36) * 2);
  puVar22 = pUVar3 + uVar35;
  puVar19 = pUVar3 + uVar35 + 1;
  local_b0 = uVar36 + 9;
  uVar23 = pUVar43[uVar32];
  pUVar43[uVar32] = uVar36;
  local_134 = uVar40 - 1;
  pBVar42 = pBVar41;
  if (uVar29 < uVar23) {
    uVar32 = 0;
    uVar35 = 0;
    local_f0 = 0;
    do {
      uVar30 = (ulong)uVar23;
      uVar9 = uVar35;
      if (local_f0 < uVar35) {
        uVar9 = local_f0;
      }
      uVar27 = uVar9 + uVar30;
      puVar17 = (ulong *)(ip + uVar9);
      if ((dictMode == ZSTD_extDict) && (uVar27 < uVar13)) {
        sVar8 = ZSTD_count_2segments
                          ((BYTE *)puVar17,local_108 + uVar30 + uVar9,iend,local_108 + uVar13,
                           pBVar41 + uVar13);
        uVar9 = sVar8 + uVar9;
        pBVar18 = local_68 + uVar30;
        pBVar42 = local_68;
        if (uVar9 + uVar30 < uVar13) {
          pBVar18 = local_108 + uVar30;
        }
      }
      else {
        puVar20 = (ulong *)(pBVar42 + uVar30 + uVar9);
        puVar12 = puVar17;
        if (puVar17 < iend + -7) {
          if (*puVar20 == *puVar17) {
            lVar21 = 0;
            do {
              puVar12 = (ulong *)(ip + lVar21 + uVar9 + 8);
              if (iend + -7 <= puVar12) {
                puVar20 = (ulong *)(pBVar41 + uVar27 + lVar21 + 8);
                goto LAB_006e2278;
              }
              lVar7 = lVar21 + uVar27 + 8;
              lVar21 = lVar21 + 8;
            } while (*(ulong *)(pBVar41 + lVar7) == *puVar12);
            uVar11 = *puVar12 ^ *(ulong *)(pBVar41 + lVar7);
            uVar27 = 0;
            if (uVar11 != 0) {
              for (; (uVar11 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
              }
            }
            uVar27 = (uVar27 >> 3 & 0x1fffffff) + lVar21;
          }
          else {
            uVar11 = *puVar17 ^ *puVar20;
            uVar27 = 0;
            if (uVar11 != 0) {
              for (; (uVar11 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
              }
            }
            uVar27 = uVar27 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_006e2278:
          if ((puVar12 < iend + -3) && ((int)*puVar20 == (int)*puVar12)) {
            puVar12 = (ulong *)((long)puVar12 + 4);
            puVar20 = (ulong *)((long)puVar20 + 4);
          }
          if ((puVar12 < iend + -1) && ((short)*puVar20 == (short)*puVar12)) {
            puVar12 = (ulong *)((long)puVar12 + 2);
            puVar20 = (ulong *)((long)puVar20 + 2);
          }
          if (puVar12 < iend) {
            puVar12 = (ulong *)((long)puVar12 + (ulong)((BYTE)*puVar20 == (BYTE)*puVar12));
          }
          uVar27 = (long)puVar12 - (long)puVar17;
        }
        uVar9 = uVar27 + uVar9;
        pBVar18 = pBVar42 + uVar30;
      }
      if (uVar32 < uVar9) {
        if (local_b0 - uVar23 < uVar9) {
          local_b0 = uVar23 + (int)uVar9;
        }
        uVar25 = (uVar36 + 1) - uVar23;
        iVar34 = 0x1f;
        if (uVar25 != 0) {
          for (; uVar25 >> iVar34 == 0; iVar34 = iVar34 + -1) {
          }
        }
        uVar25 = (int)*offsetPtr + 1;
        iVar16 = 0x1f;
        if (uVar25 != 0) {
          for (; uVar25 >> iVar16 == 0; iVar16 = iVar16 + -1) {
          }
        }
        if (iVar34 - iVar16 < ((int)uVar9 - (int)uVar32) * 4) {
          *offsetPtr = (ulong)((uVar36 + 2) - uVar23);
          uVar32 = uVar9;
        }
        if (ip + uVar9 == iend) {
          if (dictMode == ZSTD_dictMatchState) {
            local_134 = 0;
          }
          goto LAB_006e23d6;
        }
      }
      puVar28 = pUVar3 + (uVar23 & uVar24) * 2;
      if (pBVar18[uVar9] < ip[uVar9]) {
        *puVar22 = uVar23;
        if (uVar23 <= uVar2) {
          puVar22 = &local_70;
          goto LAB_006e23d6;
        }
        puVar28 = puVar28 + 1;
        puVar22 = puVar28;
        local_f0 = uVar9;
      }
      else {
        *puVar19 = uVar23;
        uVar35 = uVar9;
        puVar19 = puVar28;
        if (uVar23 <= uVar2) {
          puVar19 = &local_70;
          goto LAB_006e23d6;
        }
      }
      bVar44 = local_134 == 0;
      local_134 = local_134 + -1;
      if ((bVar44) || (uVar23 = *puVar28, uVar23 <= uVar29)) goto LAB_006e23d6;
    } while( true );
  }
  uVar32 = 0;
LAB_006e23d6:
  *puVar19 = 0;
  *puVar22 = 0;
  if ((dictMode == ZSTD_dictMatchState) && (local_134 != 0)) {
    pZVar4 = ms->dictMatchState;
    if ((uint)local_58 < 4) {
      sVar8 = (*(code *)(&DAT_007d5c6c + *(int *)(&DAT_007d5c6c + local_58 * 4)))
                        (&DAT_007d5c6c + *(int *)(&DAT_007d5c6c + local_58 * 4));
      return sVar8;
    }
    pBVar41 = (pZVar4->window).nextSrc;
    pBVar18 = (pZVar4->window).base;
    uVar35 = (long)pBVar41 - (long)pBVar18;
    uVar2 = (pZVar4->window).lowLimit;
    uVar23 = ~(-1 << ((char)(pZVar4->cParams).chainLog - 1U & 0x1f));
    iVar34 = (int)uVar35;
    uVar29 = iVar34 - uVar23;
    if (iVar34 - uVar2 <= uVar23) {
      uVar29 = uVar2;
    }
    uVar24 = pZVar4->hashTable
             [(uint)(*(int *)ip * -0x61c8864f) >> (-(char)(pZVar4->cParams).hashLog & 0x1fU)];
    if (uVar2 < uVar24) {
      uVar25 = (ms->window).dictLimit;
      uVar26 = (ms->window).lowLimit - iVar34;
      pUVar43 = pZVar4->chainTable;
      uVar13 = 0;
      local_e8 = 0;
      do {
        local_134 = local_134 + -1;
        uVar9 = uVar13;
        if (local_e8 < uVar13) {
          uVar9 = local_e8;
        }
        uVar30 = (ulong)uVar24;
        pBVar1 = pBVar18 + uVar30;
        sVar8 = ZSTD_count_2segments(ip + uVar9,pBVar1 + uVar9,iend,pBVar41,pBVar42 + uVar25);
        uVar9 = sVar8 + uVar9;
        pBVar33 = pBVar42 + uVar30 + uVar26;
        if (uVar9 + uVar30 < (uVar35 & 0xffffffff)) {
          pBVar33 = pBVar1;
        }
        if (uVar32 < uVar9) {
          iVar16 = uVar26 + uVar24;
          uVar37 = (uVar36 + 1) - iVar16;
          iVar34 = 0x1f;
          if (uVar37 != 0) {
            for (; uVar37 >> iVar34 == 0; iVar34 = iVar34 + -1) {
            }
          }
          uVar37 = (int)*offsetPtr + 1;
          iVar5 = 0x1f;
          if (uVar37 != 0) {
            for (; uVar37 >> iVar5 == 0; iVar5 = iVar5 + -1) {
            }
          }
          if (iVar34 - iVar5 < ((int)uVar9 - (int)uVar32) * 4) {
            *offsetPtr = (ulong)((uVar36 + 2) - iVar16);
            uVar32 = uVar9;
          }
          if (ip + uVar9 == iend) break;
        }
        puVar22 = pUVar43 + (uVar24 & uVar23) * 2;
        if (pBVar33[uVar9] < ip[uVar9]) {
          if (uVar24 <= uVar29) break;
          puVar22 = puVar22 + 1;
          local_e8 = uVar9;
        }
        else {
          uVar13 = uVar9;
          if (uVar24 <= uVar29) break;
        }
        if ((local_134 == 0) || (uVar24 = *puVar22, uVar24 <= uVar2)) break;
      } while( true );
    }
  }
  ms->nextToUpdate = local_b0 - 8;
  return uVar32;
}

Assistant:

static size_t
ZSTD_DUBT_findBestMatch(ZSTD_matchState_t* ms,
                        const BYTE* const ip, const BYTE* const iend,
                        size_t* offsetPtr,
                        U32 const mls,
                        const ZSTD_dictMode_e dictMode)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32*   const hashTable = ms->hashTable;
    U32    const hashLog = cParams->hashLog;
    size_t const h  = ZSTD_hashPtr(ip, hashLog, mls);
    U32          matchIndex  = hashTable[h];

    const BYTE* const base = ms->window.base;
    U32    const curr = (U32)(ip-base);
    U32    const windowLow = ZSTD_getLowestMatchIndex(ms, curr, cParams->windowLog);

    U32*   const bt = ms->chainTable;
    U32    const btLog  = cParams->chainLog - 1;
    U32    const btMask = (1 << btLog) - 1;
    U32    const btLow = (btMask >= curr) ? 0 : curr - btMask;
    U32    const unsortLimit = MAX(btLow, windowLow);

    U32*         nextCandidate = bt + 2*(matchIndex&btMask);
    U32*         unsortedMark = bt + 2*(matchIndex&btMask) + 1;
    U32          nbCompares = 1U << cParams->searchLog;
    U32          nbCandidates = nbCompares;
    U32          previousCandidate = 0;

    DEBUGLOG(7, "ZSTD_DUBT_findBestMatch (%u) ", curr);
    assert(ip <= iend-8);   /* required for h calculation */
    assert(dictMode != ZSTD_dedicatedDictSearch);

    /* reach end of unsorted candidates list */
    while ( (matchIndex > unsortLimit)
         && (*unsortedMark == ZSTD_DUBT_UNSORTED_MARK)
         && (nbCandidates > 1) ) {
        DEBUGLOG(8, "ZSTD_DUBT_findBestMatch: candidate %u is unsorted",
                    matchIndex);
        *unsortedMark = previousCandidate;  /* the unsortedMark becomes a reversed chain, to move up back to original position */
        previousCandidate = matchIndex;
        matchIndex = *nextCandidate;
        nextCandidate = bt + 2*(matchIndex&btMask);
        unsortedMark = bt + 2*(matchIndex&btMask) + 1;
        nbCandidates --;
    }

    /* nullify last candidate if it's still unsorted
     * simplification, detrimental to compression ratio, beneficial for speed */
    if ( (matchIndex > unsortLimit)
      && (*unsortedMark==ZSTD_DUBT_UNSORTED_MARK) ) {
        DEBUGLOG(7, "ZSTD_DUBT_findBestMatch: nullify last unsorted candidate %u",
                    matchIndex);
        *nextCandidate = *unsortedMark = 0;
    }

    /* batch sort stacked candidates */
    matchIndex = previousCandidate;
    while (matchIndex) {  /* will end on matchIndex == 0 */
        U32* const nextCandidateIdxPtr = bt + 2*(matchIndex&btMask) + 1;
        U32 const nextCandidateIdx = *nextCandidateIdxPtr;
        ZSTD_insertDUBT1(ms, matchIndex, iend,
                         nbCandidates, unsortLimit, dictMode);
        matchIndex = nextCandidateIdx;
        nbCandidates++;
    }

    /* find longest match */
    {   size_t commonLengthSmaller = 0, commonLengthLarger = 0;
        const BYTE* const dictBase = ms->window.dictBase;
        const U32 dictLimit = ms->window.dictLimit;
        const BYTE* const dictEnd = dictBase + dictLimit;
        const BYTE* const prefixStart = base + dictLimit;
        U32* smallerPtr = bt + 2*(curr&btMask);
        U32* largerPtr  = bt + 2*(curr&btMask) + 1;
        U32 matchEndIdx = curr + 8 + 1;
        U32 dummy32;   /* to be nullified at the end */
        size_t bestLength = 0;

        matchIndex  = hashTable[h];
        hashTable[h] = curr;   /* Update Hash Table */

        while (nbCompares-- && (matchIndex > windowLow)) {
            U32* const nextPtr = bt + 2*(matchIndex & btMask);
            size_t matchLength = MIN(commonLengthSmaller, commonLengthLarger);   /* guaranteed minimum nb of common bytes */
            const BYTE* match;

            if ((dictMode != ZSTD_extDict) || (matchIndex+matchLength >= dictLimit)) {
                match = base + matchIndex;
                matchLength += ZSTD_count(ip+matchLength, match+matchLength, iend);
            } else {
                match = dictBase + matchIndex;
                matchLength += ZSTD_count_2segments(ip+matchLength, match+matchLength, iend, dictEnd, prefixStart);
                if (matchIndex+matchLength >= dictLimit)
                    match = base + matchIndex;   /* to prepare for next usage of match[matchLength] */
            }

            if (matchLength > bestLength) {
                if (matchLength > matchEndIdx - matchIndex)
                    matchEndIdx = matchIndex + (U32)matchLength;
                if ( (4*(int)(matchLength-bestLength)) > (int)(ZSTD_highbit32(curr-matchIndex+1) - ZSTD_highbit32((U32)offsetPtr[0]+1)) )
                    bestLength = matchLength, *offsetPtr = ZSTD_REP_MOVE + curr - matchIndex;
                if (ip+matchLength == iend) {   /* equal : no way to know if inf or sup */
                    if (dictMode == ZSTD_dictMatchState) {
                        nbCompares = 0; /* in addition to avoiding checking any
                                         * further in this loop, make sure we
                                         * skip checking in the dictionary. */
                    }
                    break;   /* drop, to guarantee consistency (miss a little bit of compression) */
                }
            }

            if (match[matchLength] < ip[matchLength]) {
                /* match is smaller than current */
                *smallerPtr = matchIndex;             /* update smaller idx */
                commonLengthSmaller = matchLength;    /* all smaller will now have at least this guaranteed common length */
                if (matchIndex <= btLow) { smallerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
                smallerPtr = nextPtr+1;               /* new "smaller" => larger of match */
                matchIndex = nextPtr[1];              /* new matchIndex larger than previous (closer to current) */
            } else {
                /* match is larger than current */
                *largerPtr = matchIndex;
                commonLengthLarger = matchLength;
                if (matchIndex <= btLow) { largerPtr=&dummy32; break; }   /* beyond tree size, stop the search */
                largerPtr = nextPtr;
                matchIndex = nextPtr[0];
        }   }

        *smallerPtr = *largerPtr = 0;

        if (dictMode == ZSTD_dictMatchState && nbCompares) {
            bestLength = ZSTD_DUBT_findBetterDictMatch(
                    ms, ip, iend,
                    offsetPtr, bestLength, nbCompares,
                    mls, dictMode);
        }

        assert(matchEndIdx > curr+8); /* ensure nextToUpdate is increased */
        ms->nextToUpdate = matchEndIdx - 8;   /* skip repetitive patterns */
        if (bestLength >= MINMATCH) {
            U32 const mIndex = curr - ((U32)*offsetPtr - ZSTD_REP_MOVE); (void)mIndex;
            DEBUGLOG(8, "ZSTD_DUBT_findBestMatch(%u) : found match of length %u and offsetCode %u (pos %u)",
                        curr, (U32)bestLength, (U32)*offsetPtr, mIndex);
        }
        return bestLength;
    }
}